

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O3

QJsonArray convertToJsonArray(QCborContainerPrivate *d,ConversionMode mode)

{
  QExplicitlySharedDataPointer<QCborContainerPrivate> QVar1;
  ConversionMode in_EDX;
  undefined4 in_register_00000034;
  QCborContainerPrivate *d_00;
  ulong idx;
  long in_FS_OFFSET;
  QJsonValue QStack_48;
  totally_ordered_wrapper<QCborContainerPrivate_*> local_30;
  
  d_00 = (QCborContainerPrivate *)CONCAT44(in_register_00000034,mode);
  local_30.ptr = *(QCborContainerPrivate **)(in_FS_OFFSET + 0x28);
  *(undefined1 **)d = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)d);
  if ((d_00 != (QCborContainerPrivate *)0x0) && ((d_00->elements).d.size != 0)) {
    idx = 0;
    do {
      qt_convertToJson(&QStack_48,d_00,idx,in_EDX);
      QJsonArray::append((QJsonArray *)d,&QStack_48);
      QJsonValue::~QJsonValue(&QStack_48);
      idx = idx + 1;
    } while (idx < (ulong)(d_00->elements).d.size);
  }
  QVar1.d.ptr = (totally_ordered_wrapper<QCborContainerPrivate_*>)
                ((totally_ordered_wrapper<QCborContainerPrivate_*> *)(in_FS_OFFSET + 0x28))->ptr;
  if (QVar1.d.ptr == (totally_ordered_wrapper<QCborContainerPrivate_*>)local_30.ptr) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)QVar1.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

static QJsonArray convertToJsonArray(QCborContainerPrivate *d,
                                     ConversionMode mode = ConversionMode::FromRaw)
{
    QJsonArray a;
    if (d) {
        for (qsizetype idx = 0; idx < d->elements.size(); ++idx)
            a.append(qt_convertToJson(d, idx, mode));
    }
    return a;
}